

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O2

double __thiscall
despot::LaserTag::ObsProb(LaserTag *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  uint uVar1;
  int dir;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  if ((this->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[*(int *)(state + 0xc)] ==
      (this->super_BaseTag).opp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[*(int *)(state + 0xc)]) {
    if ((this->super_BaseTag).same_loc_obs_ == obs) {
      dVar4 = 1.0;
    }
    else {
LAB_001186b0:
      dVar4 = 0.0;
    }
  }
  else {
    dVar4 = 1.0;
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < NBEAMS; lVar2 = lVar2 + 1) {
      uVar1 = ~(uint)(-1L << ((byte)BITS_PER_READING & 0x3f)) &
              (uint)(obs >> ((char)lVar2 * (byte)BITS_PER_READING & 0x3f));
      dVar5 = LaserRange(this,state,(int)lVar2);
      if (dVar5 / this->unit_size_ <= (double)(int)uVar1) goto LAB_001186b0;
      dVar4 = dVar4 * *(double *)
                       (*(long *)(*(long *)&(this->reading_distributions_).
                                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [*(int *)(state + 0xc)].
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data + lVar3) +
                       (long)(int)uVar1 * 8);
      lVar3 = lVar3 + 0x18;
    }
  }
  return dVar4;
}

Assistant:

double LaserTag::ObsProb(OBS_TYPE obs, const State& state, ACT_TYPE action) const {
	if (rob_[state.state_id] == opp_[state.state_id])
		return obs == same_loc_obs_;

	double prod = 1.0;
	for (int dir = 0; dir < NBEAMS; dir++) {
		int reading = GetReading(obs, dir);
		if (reading >= LaserRange(state, dir) / unit_size_)
			return 0;
		double prob_mass = reading_distributions_[state.state_id][dir][reading];
		prod *= prob_mass;
	}

	return prod;
}